

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

GradientStop * __thiscall
lunasvg::SVGStopElement::gradientStop
          (GradientStop *__return_storage_ptr__,SVGStopElement *this,float opacity)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = opacity * this->m_stop_opacity;
  uVar1 = (this->m_stop_color).m_value;
  fVar3 = 1.0;
  if (fVar2 <= 1.0) {
    fVar3 = fVar2;
  }
  __return_storage_ptr__->offset = *(float *)&(this->m_offset).super_SVGProperty.field_0xc;
  (__return_storage_ptr__->color).r = (float)(uVar1 >> 0x10 & 0xff) / 255.0;
  (__return_storage_ptr__->color).g = (float)(uVar1 >> 8 & 0xff) / 255.0;
  (__return_storage_ptr__->color).b = (float)(uVar1 & 0xff) / 255.0;
  (__return_storage_ptr__->color).a =
       (float)((int)((float)(~-(uint)(fVar2 < 0.0) & (uint)fVar3) * (float)(uVar1 >> 0x18)) & 0xff)
       / 255.0;
  return __return_storage_ptr__;
}

Assistant:

GradientStop SVGStopElement::gradientStop(float opacity) const
{
    Color stopColor = m_stop_color.colorWithAlpha(m_stop_opacity * opacity);
    GradientStop gradientStop = {
        m_offset.value(), { stopColor.redF(), stopColor.greenF(), stopColor.blueF(), stopColor.alphaF() }
    };

    return gradientStop;
}